

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestOneofParsingLite::~TestOneofParsingLite(TestOneofParsingLite *this)

{
  ~TestOneofParsingLite(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestOneofParsingLite::~TestOneofParsingLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestOneofParsingLite)
  SharedDtor(*this);
}